

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

text * lest::not_expr(text *__return_storage_ptr__,text *message)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  text *local_18;
  text *message_local;
  
  local_18 = message;
  message_local = __return_storage_ptr__;
  std::operator+(&local_58,"! ( ",message);
  std::operator+(&local_38,&local_58," )");
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

inline text not_expr( text message )
{
    return "! ( " + message + " )";
}